

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyExporter.cpp
# Opt level: O2

void __thiscall Assimp::PlyExporter::WriteMeshVerts(PlyExporter *this,aiMesh *m,uint components)

{
  float fVar1;
  bool bVar2;
  ostream *poVar3;
  uint n;
  uint c;
  uint uVar4;
  ulong uVar5;
  uint c_1;
  ulong uVar6;
  
  uVar6 = 0;
  do {
    if (m->mNumVertices <= uVar6) {
      return;
    }
    poVar3 = (ostream *)std::ostream::operator<<(this,m->mVertices[uVar6].x);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,m->mVertices[uVar6].y);
    poVar3 = std::operator<<(poVar3," ");
    std::ostream::operator<<(poVar3,m->mVertices[uVar6].z);
    if ((components & 1) != 0) {
      if ((m->mNormals != (aiVector3D *)0x0) && (m->mNumVertices != 0)) {
        fVar1 = m->mNormals[uVar6].x;
        if ((ABS(fVar1) != INFINITY) &&
           ((~(uint)fVar1 & 0x7f800000) != 0 || ((uint)fVar1 & 0x7fffff) == 0)) {
          poVar3 = std::operator<<((ostream *)this," ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,m->mNormals[uVar6].x);
          poVar3 = std::operator<<(poVar3," ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,m->mNormals[uVar6].y);
          poVar3 = std::operator<<(poVar3," ");
          std::ostream::operator<<(poVar3,m->mNormals[uVar6].z);
          goto LAB_00595b73;
        }
      }
      std::operator<<((ostream *)this," 0.0 0.0 0.0");
    }
LAB_00595b73:
    uVar4 = 4;
    for (uVar5 = 0; ((uVar4 & components) != 0 && (uVar5 != 8)); uVar5 = uVar5 + 1) {
      if (((uVar5 < 8) && (m->mTextureCoords[uVar5] != (aiVector3D *)0x0)) && (m->mNumVertices != 0)
         ) {
        poVar3 = std::operator<<((ostream *)this," ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,m->mTextureCoords[uVar5][uVar6].x);
        poVar3 = std::operator<<(poVar3," ");
        std::ostream::operator<<(poVar3,m->mTextureCoords[uVar5][uVar6].y);
      }
      else {
        std::operator<<((ostream *)this," -1.0 -1.0");
      }
      uVar4 = uVar4 * 2;
    }
    uVar4 = 0x400;
    for (uVar5 = 0; ((uVar4 & components) != 0 && (uVar5 != 8)); uVar5 = uVar5 + 1) {
      if (((uVar5 < 8) && (m->mColors[uVar5] != (aiColor4D *)0x0)) && (m->mNumVertices != 0)) {
        poVar3 = std::operator<<((ostream *)this," ");
        poVar3 = (ostream *)
                 std::ostream::operator<<(poVar3,(int)(m->mColors[uVar5][uVar6].r * 255.0));
        poVar3 = std::operator<<(poVar3," ");
        poVar3 = (ostream *)
                 std::ostream::operator<<(poVar3,(int)(m->mColors[uVar5][uVar6].g * 255.0));
        poVar3 = std::operator<<(poVar3," ");
        poVar3 = (ostream *)
                 std::ostream::operator<<(poVar3,(int)(m->mColors[uVar5][uVar6].b * 255.0));
        poVar3 = std::operator<<(poVar3," ");
        std::ostream::operator<<(poVar3,(int)(m->mColors[uVar5][uVar6].a * 255.0));
      }
      else {
        std::operator<<((ostream *)this," 0 0 0");
      }
      uVar4 = uVar4 * 2;
    }
    if ((components & 2) != 0) {
      bVar2 = aiMesh::HasTangentsAndBitangents(m);
      if (bVar2) {
        poVar3 = std::operator<<((ostream *)this," ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,m->mTangents[uVar6].x);
        poVar3 = std::operator<<(poVar3," ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,m->mTangents[uVar6].y);
        poVar3 = std::operator<<(poVar3," ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,m->mTangents[uVar6].z);
        poVar3 = std::operator<<(poVar3," ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,m->mBitangents[uVar6].x);
        poVar3 = std::operator<<(poVar3," ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,m->mBitangents[uVar6].y);
        poVar3 = std::operator<<(poVar3," ");
        std::ostream::operator<<(poVar3,m->mBitangents[uVar6].z);
      }
      else {
        std::operator<<((ostream *)this," 0.0 0.0 0.0 0.0 0.0 0.0");
      }
    }
    std::operator<<((ostream *)this,(string *)&this->endl);
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

void PlyExporter::WriteMeshVerts(const aiMesh* m, unsigned int components)
{
    static const ai_real inf = std::numeric_limits<ai_real>::infinity();

    // If a component (for instance normal vectors) is present in at least one mesh in the scene,
    // then default values are written for meshes that do not contain this component.
    for (unsigned int i = 0; i < m->mNumVertices; ++i) {
        mOutput <<
            m->mVertices[i].x << " " <<
            m->mVertices[i].y << " " <<
            m->mVertices[i].z
        ;
        if(components & PLY_EXPORT_HAS_NORMALS) {
            if (m->HasNormals() && is_not_qnan(m->mNormals[i].x) && std::fabs(m->mNormals[i].x) != inf) {
                mOutput <<
                    " " << m->mNormals[i].x <<
                    " " << m->mNormals[i].y <<
                    " " << m->mNormals[i].z;
            }
            else {
                mOutput << " 0.0 0.0 0.0";
            }
        }

        for (unsigned int n = PLY_EXPORT_HAS_TEXCOORDS, c = 0; (components & n) && c != AI_MAX_NUMBER_OF_TEXTURECOORDS; n <<= 1, ++c) {
            if (m->HasTextureCoords(c)) {
                mOutput <<
                    " " << m->mTextureCoords[c][i].x <<
                    " " << m->mTextureCoords[c][i].y;
            }
            else {
                mOutput << " -1.0 -1.0";
            }
        }

        for (unsigned int n = PLY_EXPORT_HAS_COLORS, c = 0; (components & n) && c != AI_MAX_NUMBER_OF_COLOR_SETS; n <<= 1, ++c) {
            if (m->HasVertexColors(c)) {
                mOutput <<
                    " " << (int)(m->mColors[c][i].r * 255) <<
                    " " << (int)(m->mColors[c][i].g * 255) <<
                    " " << (int)(m->mColors[c][i].b * 255) <<
                    " " << (int)(m->mColors[c][i].a * 255);
            }
            else {
                mOutput << " 0 0 0";
            }
        }

        if(components & PLY_EXPORT_HAS_TANGENTS_BITANGENTS) {
            if (m->HasTangentsAndBitangents()) {
                mOutput <<
                " " << m->mTangents[i].x <<
                " " << m->mTangents[i].y <<
                " " << m->mTangents[i].z <<
                " " << m->mBitangents[i].x <<
                " " << m->mBitangents[i].y <<
                " " << m->mBitangents[i].z
                ;
            }
            else {
                mOutput << " 0.0 0.0 0.0 0.0 0.0 0.0";
            }
        }

        mOutput << endl;
    }
}